

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigShow.c
# Opt level: O2

void Aig_WriteDotAig(Aig_Man_t *pMan,char *pFileName,int fHaig,Vec_Ptr_t *vBold)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  void *pvVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  Vec_Ptr_t *p;
  uint uVar8;
  bool bVar9;
  
  if (200 < pMan->nObjs[6] + pMan->nObjs[5]) {
    fwrite("Cannot visualize AIG with more than 200 nodes.\n",0x2f,1,_stdout);
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    if (vBold != (Vec_Ptr_t *)0x0) {
      for (iVar7 = 0; iVar7 < vBold->nSize; iVar7 = iVar7 + 1) {
        pvVar4 = Vec_PtrEntry(vBold,iVar7);
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) | 0x20;
      }
    }
    uVar1 = Aig_ManLevels(pMan);
    uVar2 = uVar1 + 1;
    for (iVar7 = 0; iVar7 < pMan->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pMan->vCos,iVar7);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xff000000ffffffff | (ulong)(uVar2 & 0xffffff) << 0x20;
    }
    fprintf(__stream,"# %s\n","AIG structure generated by IVY package");
    fputc(10,__stream);
    fwrite("digraph AIG {\n",0xe,1,__stream);
    fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
    fwrite("center = true;\n",0xf,1,__stream);
    fwrite("edge [dir = back];\n",0x13,1,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
    fwrite("  edge [style = invis];\n",0x18,1,__stream);
    fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
    fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
    for (uVar8 = uVar2; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      fprintf(__stream,"  Level%d",(ulong)uVar8);
      fwrite(" [label = ",10,1,__stream);
      fputc(0x22,__stream);
      fputc(0x22,__stream);
      fwrite("];\n",3,1,__stream);
    }
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
    uVar8 = uVar2;
    while (-1 < (int)uVar8) {
      fprintf(__stream,"  Level%d",(ulong)uVar8);
      bVar9 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar9) {
        fputc(0x3b,__stream);
      }
      else {
        fwrite(" ->",3,1,__stream);
      }
    }
    fputc(10,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fwrite("  LevelTitle1;\n",0xf,1,__stream);
    fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
    fwrite("          fontsize=20,\n",0x17,1,__stream);
    fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
    fwrite("          label=\"",0x11,1,__stream);
    fputs("AIG structure visualized by ABC",__stream);
    fwrite("\\n",2,1,__stream);
    fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
    fwrite("\"\n",2,1,__stream);
    fwrite("         ];\n",0xc,1,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fwrite("  LevelTitle2;\n",0xf,1,__stream);
    fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
    fwrite("          fontsize=18,\n",0x17,1,__stream);
    fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
    fwrite("          label=\"",0x11,1,__stream);
    fprintf(__stream,"The set contains %d logic nodes and spans %d levels.",
            (ulong)(uint)(pMan->nObjs[6] + pMan->nObjs[5]),(ulong)uVar2);
    fwrite("\\n",2,1,__stream);
    fwrite("\"\n",2,1,__stream);
    fwrite("         ];\n",0xc,1,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",(ulong)uVar2);
    for (iVar7 = 0; iVar7 < pMan->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pMan->vCos,iVar7);
      fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)*(uint *)((long)pvVar4 + 0x24));
      fprintf(__stream,", shape = %s","invtriangle");
      fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
      fwrite("];\n",3,1,__stream);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    while( true ) {
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      if ((int)uVar1 < 1) break;
      fprintf(__stream,"  Level%d;\n",(ulong)uVar1);
      for (iVar7 = 0; iVar7 < pMan->vObjs->nSize; iVar7 = iVar7 + 1) {
        pvVar4 = Vec_PtrEntry(pMan->vObjs,iVar7);
        if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x1c) & 0xffffff) == uVar1)) {
          fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)*(uint *)((long)pvVar4 + 0x24));
          fwrite(", shape = ellipse",0x11,1,__stream);
          if ((vBold != (Vec_Ptr_t *)0x0) && ((*(byte *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
            fwrite(", style = filled",0x10,1,__stream);
          }
          fwrite("];\n",3,1,__stream);
        }
      }
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      uVar1 = uVar1 - 1;
    }
    fprintf(__stream,"  Level%d;\n",0);
    if ((*(uint *)&pMan->pConst1->field_0x18 & 0xffffffc0) != 0) {
      fprintf(__stream,"  Node%d [label = \"Const1\"",(ulong)(uint)pMan->pConst1->Id);
      fwrite(", shape = ellipse",0x11,1,__stream);
      fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
      fwrite("];\n",3,1,__stream);
    }
    for (iVar7 = 0; iVar7 < pMan->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pMan->vCis,iVar7);
      fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)*(uint *)((long)pvVar4 + 0x24));
      fprintf(__stream,", shape = %s","triangle");
      fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
      fwrite("];\n",3,1,__stream);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
    iVar7 = 0;
    while( true ) {
      p = pMan->vCos;
      iVar3 = p->nSize;
      if (iVar3 <= iVar7) break;
      pvVar4 = Vec_PtrEntry(p,iVar7);
      fprintf(__stream,"title2 -> Node%d [style = invis];\n",(ulong)*(uint *)((long)pvVar4 + 0x24));
      iVar7 = iVar7 + 1;
    }
    uVar5 = 0xffffffffffffffff;
    for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(p,iVar7);
      if (iVar7 != 0) {
        fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar5 & 0xffffffff,
                (ulong)*(uint *)((long)pvVar4 + 0x24));
      }
      uVar5 = (ulong)*(uint *)((long)pvVar4 + 0x24);
      p = pMan->vCos;
      iVar3 = p->nSize;
    }
    for (iVar7 = 0; iVar7 < pMan->vObjs->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pMan->vObjs,iVar7);
      if (pvVar4 != (void *)0x0) {
        uVar1 = (uint)*(undefined8 *)((long)pvVar4 + 0x18);
        if ((0xfffffffd < (uVar1 & 7) - 7) || ((ulong)(uVar1 & 7) - 3 < 2)) {
          fprintf(__stream,"Node%d",(ulong)*(uint *)((long)pvVar4 + 0x24));
          fwrite(" -> ",4,1,__stream);
          uVar5 = 0xffffffffffffffff;
          if (*(ulong *)((long)pvVar4 + 8) != 0) {
            uVar5 = (ulong)*(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24);
          }
          fprintf(__stream,"Node%d",uVar5);
          fwrite(" [",2,1,__stream);
          pcVar6 = "dotted";
          if ((*(byte *)((long)pvVar4 + 8) & 1) == 0) {
            pcVar6 = "bold";
          }
          fprintf(__stream,"style = %s",pcVar6);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
          if (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7) {
            fprintf(__stream,"Node%d",(ulong)*(uint *)((long)pvVar4 + 0x24));
            fwrite(" -> ",4,1,__stream);
            uVar5 = 0xffffffffffffffff;
            if (*(ulong *)((long)pvVar4 + 0x10) != 0) {
              uVar5 = (ulong)*(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x24
                                      );
            }
            fprintf(__stream,"Node%d",uVar5);
            fwrite(" [",2,1,__stream);
            pcVar6 = "dotted";
            if ((*(byte *)((long)pvVar4 + 0x10) & 1) == 0) {
              pcVar6 = "bold";
            }
            fprintf(__stream,"style = %s",pcVar6);
            fputc(0x5d,__stream);
            fwrite(";\n",2,1,__stream);
          }
        }
      }
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fclose(__stream);
    if (vBold != (Vec_Ptr_t *)0x0) {
      for (iVar7 = 0; iVar7 < vBold->nSize; iVar7 = iVar7 + 1) {
        pvVar4 = Vec_PtrEntry(vBold,iVar7);
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) & 0xdf;
      }
    }
    for (iVar7 = 0; iVar7 < pMan->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pMan->vCos,iVar7);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xff000000ffffffff |
           *(ulong *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) & 0xffffff00000000
      ;
    }
    return;
  }
  fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the graph structure of AIG for DOT.]

  Description [Useful for graph visualization using tools such as GraphViz: 
  http://www.graphviz.org/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Aig_WriteDotAig( Aig_Man_t * pMan, char * pFileName, int fHaig, Vec_Ptr_t * vBold )
{
    FILE * pFile;
    Aig_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;

    if ( Aig_ManNodeNum(pMan) > 200 )
    {
        fprintf( stdout, "Cannot visualize AIG with more than 200 nodes.\n" );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Vec_PtrForEachEntry( Aig_Obj_t *, vBold, pNode, i )
            pNode->fMarkB = 1;

    // compute levels
//    LevelMax = 1 + Aig_ManSetLevels( pMan, fHaig );
    LevelMax = 1 + Aig_ManLevels( pMan );
    Aig_ManForEachCo( pMan, pNode, i )
        pNode->Level = LevelMax;

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by IVY package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The set contains %d logic nodes and spans %d levels.", Aig_ManNodeNum(pMan), LevelMax );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Aig_ManForEachCo( pMan, pNode, i )
    {
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_in":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_in":""), 
                    Aig_Regular(pNode->pEquiv)->Id, Aig_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Aig_ManForEachObj( pMan, pNode, i )
        {
            if ( (int)pNode->Level != Level )
                continue;
/*
            if ( fHaig || pNode->pEquiv == NULL )
                fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            else 
                fprintf( pFile, "  Node%d [label = \"%d(%d%s)\"", pNode->Id, pNode->Id, 
                    Aig_Regular(pNode->pEquiv)->Id, Aig_IsComplement(pNode->pEquiv)? "\'":"" );
*/
            fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id ); 

            fprintf( pFile, ", shape = ellipse" );
            if ( vBold && pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( Aig_ObjRefs(Aig_ManConst1(pMan)) > 0 )
    {
        pNode = Aig_ManConst1(pMan);
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const1\"", pNode->Id );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Aig_ManForEachCi( pMan, pNode, i )
    {
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_out":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_out":""), 
                    Aig_Regular(pNode->pEquiv)->Id, Aig_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Aig_ManForEachCo( pMan, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", pNode->Id );
    // generate invisible edges among the COs
    Prev = -1;
    Aig_ManForEachCo( pMan, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, pNode->Id );
        Prev = pNode->Id;
    }

    // generate edges
    Aig_ManForEachObj( pMan, pNode, i )
    {
        if ( !Aig_ObjIsNode(pNode) && !Aig_ObjIsCo(pNode) && !Aig_ObjIsBuf(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  pNode->Id );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Aig_ObjFaninId0(pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Aig_ObjFaninC0(pNode)? "dotted" : "bold" );
//        if ( Aig_NtkIsSeq(pNode->pMan) && Seq_ObjFaninL0(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,0) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Aig_ObjIsNode(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  pNode->Id );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Aig_ObjFaninId1(pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Aig_ObjFaninC1(pNode)? "dotted" : "bold" );
//        if ( Aig_NtkIsSeq(pNode->pMan) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
/*
        // generate the edges between the equivalent nodes
        if ( fHaig && pNode->pEquiv && Aig_ObjRefs(pNode) > 0 )
        {
            pPrev = pNode;
            for ( pTemp = pNode->pEquiv; pTemp != pNode; pTemp = Aig_Regular(pTemp->pEquiv) )
            {
                fprintf( pFile, "Node%d",  pPrev->Id );
                fprintf( pFile, " -> " );
                fprintf( pFile, "Node%d",  pTemp->Id );
                fprintf( pFile, " [style = %s]", Aig_IsComplement(pTemp->pEquiv)? "dotted" : "bold" );
                fprintf( pFile, ";\n" );
                pPrev = pTemp;
            }
            // connect the last node with the first
            fprintf( pFile, "Node%d",  pPrev->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " [style = %s]", Aig_IsComplement(pPrev->pEquiv)? "dotted" : "bold" );
            fprintf( pFile, ";\n" );
        }
*/
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Vec_PtrForEachEntry( Aig_Obj_t *, vBold, pNode, i )
            pNode->fMarkB = 0;

    Aig_ManForEachCo( pMan, pNode, i )
        pNode->Level = Aig_ObjFanin0(pNode)->Level;
}